

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.c
# Opt level: O1

ch_closure * ch_loadclosure(ch_function *function,uint8_t upvalue_count)

{
  int iVar1;
  ch_upvalue **__s;
  ch_closure *pcVar2;
  undefined7 in_register_00000031;
  
  iVar1 = (int)CONCAT71(in_register_00000031,upvalue_count);
  __s = (ch_upvalue **)malloc((ulong)(uint)(iVar1 * 8));
  if (iVar1 != 0) {
    memset(__s,0,(ulong)upvalue_count << 3);
  }
  pcVar2 = (ch_closure *)malloc(0x20);
  pcVar2->function = function;
  (pcVar2->object).type = TYPE_CLOSURE;
  pcVar2->upvalues = __s;
  pcVar2->upvalue_count = upvalue_count;
  return pcVar2;
}

Assistant:

ch_closure *ch_loadclosure(ch_function* function, uint8_t upvalue_count) {
  ch_upvalue** upvalues = malloc(sizeof(ch_upvalue*) * upvalue_count);
  for(uint8_t i = 0; i < upvalue_count; i++) {
    upvalues[i] = NULL;
  }

  ch_closure *closure = malloc(sizeof(ch_closure));
  closure->function = function;
  closure->object.type = TYPE_CLOSURE;
  closure->upvalues = upvalues;
  closure->upvalue_count = upvalue_count;

  return closure;
}